

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.cxx
# Opt level: O3

bool __thiscall
cmSeparateArgumentsCommand::InitialPass
          (cmSeparateArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  pointer pbVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string var;
  string command;
  ostringstream e;
  undefined1 local_208 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  char *local_1c8;
  undefined8 local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar5 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"must be given at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    bVar6 = false;
  }
  else {
    local_1e8._M_allocated_capacity = (size_type)&local_1d8;
    local_1e8._8_8_ = 0;
    local_1d8._M_local_buf[0] = '\0';
    local_1c8 = &local_1b8;
    local_1c0 = 0;
    local_1b8 = '\0';
    iVar8 = 1;
    iVar1 = 0;
    uVar9 = 0;
    uVar11 = 1;
    do {
      if (iVar8 == 3) {
        iVar8 = 0;
        std::__cxx11::string::_M_assign((string *)&local_1c8);
      }
      else if (iVar8 == 2) {
        iVar1 = std::__cxx11::string::compare((char *)(pbVar5 + uVar9));
        iVar8 = 3;
        if (iVar1 == 0) {
          iVar1 = 1;
        }
        else {
          iVar2 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar9));
          iVar1 = 2;
          if (iVar2 != 0) goto LAB_0028214f;
        }
      }
      else {
        if (iVar8 != 1) {
LAB_0028214f:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"given unknown argument ",0x17);
          pbVar5 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,pbVar5[uVar9]._M_dataplus._M_p,
                     pbVar5[uVar9]._M_string_length);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_208);
          if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
            operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar6 = false;
          goto LAB_00282357;
        }
        iVar8 = 2;
        std::__cxx11::string::_M_assign((string *)local_1e8._M_local_buf);
      }
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar11 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5
                              );
      uVar9 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar6);
    if (iVar1 == 0) {
      pcVar3 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,(string *)&local_1e8);
      bVar6 = true;
      if (pcVar3 != (char *)0x0) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        sVar4 = strlen(pcVar3);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar3,pcVar3 + sVar4);
        cmsys::SystemTools::ReplaceString((string *)local_1a8," ",";");
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,(string *)&local_1e8,(char *)local_1a8._0_8_);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
      }
    }
    else {
      local_208._0_8_ = (pointer)0x0;
      local_208._8_8_ = (pointer)0x0;
      local_208._16_8_ = (pointer)0x0;
      if (iVar1 == 1) {
        cmSystemTools::ParseUnixCommandLine
                  (local_1c8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_208);
      }
      else {
        cmSystemTools::ParseWindowsCommandLine
                  (local_1c8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_208);
      }
      pcVar3 = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = pcVar3;
      if (local_208._0_8_ != local_208._8_8_) {
        pbVar5 = (pointer)local_208._0_8_;
        do {
          std::__cxx11::string::append(local_1a8);
          if (pbVar5->_M_string_length != 0) {
            pcVar10 = (pbVar5->_M_dataplus)._M_p;
            do {
              cVar7 = (char)local_1a8;
              if (*pcVar10 == ';') {
                std::__cxx11::string::push_back(cVar7);
              }
              std::__cxx11::string::push_back(cVar7);
              pcVar10 = pcVar10 + 1;
            } while (pcVar10 != (pbVar5->_M_dataplus)._M_p + pbVar5->_M_string_length);
          }
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != (pointer)local_208._8_8_);
      }
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,(string *)&local_1e8,(char *)local_1a8._0_8_);
      if ((char *)local_1a8._0_8_ != pcVar3) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_208);
      bVar6 = true;
    }
LAB_00282357:
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_allocated_capacity != &local_1d8) {
      operator_delete((void *)local_1e8._M_allocated_capacity,
                      CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1)
      ;
    }
  }
  return bVar6;
}

Assistant:

bool cmSeparateArgumentsCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.empty())
    {
    this->SetError("must be given at least one argument.");
    return false;
    }

  std::string var;
  std::string command;
  enum Mode { ModeOld, ModeUnix, ModeWindows };
  Mode mode = ModeOld;
  enum Doing { DoingNone, DoingVariable, DoingMode, DoingCommand };
  Doing doing = DoingVariable;
  for(unsigned int i=0; i < args.size(); ++i)
    {
    if(doing == DoingVariable)
      {
      var = args[i];
      doing = DoingMode;
      }
    else if(doing == DoingMode && args[i] == "UNIX_COMMAND")
      {
      mode = ModeUnix;
      doing = DoingCommand;
      }
    else if(doing == DoingMode && args[i] == "WINDOWS_COMMAND")
      {
      mode = ModeWindows;
      doing = DoingCommand;
      }
    else if(doing == DoingCommand)
      {
      command = args[i];
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }

  if(mode == ModeOld)
    {
    // Original space-replacement version of command.
    if(const char* def = this->Makefile->GetDefinition(var))
      {
      std::string value = def;
      cmSystemTools::ReplaceString(value, " ", ";");
      this->Makefile->AddDefinition(var, value.c_str());
      }
    }
  else
    {
    // Parse the command line.
    std::vector<std::string> vec;
    if(mode == ModeUnix)
      {
      cmSystemTools::ParseUnixCommandLine(command.c_str(), vec);
      }
    else // if(mode == ModeWindows)
      {
      cmSystemTools::ParseWindowsCommandLine(command.c_str(), vec);
      }

    // Construct the result list value.
    std::string value;
    const char* sep = "";
    for(std::vector<std::string>::const_iterator vi = vec.begin();
        vi != vec.end(); ++vi)
      {
      // Separate from the previous argument.
      value += sep;
      sep = ";";

      // Preserve semicolons.
      for(std::string::const_iterator si = vi->begin();
          si != vi->end(); ++si)
        {
        if(*si == ';')
          {
          value += '\\';
          }
        value += *si;
        }
      }
    this->Makefile->AddDefinition(var, value.c_str());
    }

  return true;
}